

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int parseHhMmSs(char *zDate,DateTime *p)

{
  int iVar1;
  DateTime *pDVar2;
  double local_40;
  double rScale;
  double ms;
  int local_28;
  int s;
  int m;
  int h;
  DateTime *p_local;
  char *zDate_local;
  
  rScale = 0.0;
  _m = p;
  p_local = (DateTime *)zDate;
  iVar1 = getDigits(zDate,"20c:20e",&s,&local_28);
  if (iVar1 == 2) {
    pDVar2 = (DateTime *)((long)&p_local->iJD + 5);
    if ((char)pDVar2->iJD == ':') {
      p_local = (DateTime *)((long)&p_local->iJD + 6);
      iVar1 = getDigits((char *)p_local,"20e",(long)&ms + 4);
      if (iVar1 != 1) {
        return 1;
      }
      pDVar2 = (DateTime *)((long)&p_local->iJD + 2);
      if (((char)pDVar2->iJD == '.') && ((""[*(byte *)((long)&p_local->iJD + 3)] & 4) != 0)) {
        local_40 = 1.0;
        p_local = (DateTime *)((long)&p_local->iJD + 3);
        while ((""[(byte)p_local->iJD] & 4) != 0) {
          rScale = (rScale * 10.0 + (double)(int)(char)p_local->iJD) - 48.0;
          local_40 = local_40 * 10.0;
          p_local = (DateTime *)((long)&p_local->iJD + 1);
        }
        rScale = rScale / local_40;
        pDVar2 = p_local;
      }
    }
    else {
      ms._4_4_ = 0;
    }
    p_local = pDVar2;
    _m->validJD = '\0';
    _m->rawS = '\0';
    _m->validHMS = '\x01';
    _m->h = s;
    _m->m = local_28;
    _m->s = (double)ms._4_4_ + rScale;
    iVar1 = parseTimezone((char *)p_local,_m);
    if (iVar1 == 0) {
      _m->validTZ = _m->tz != 0;
      zDate_local._4_4_ = 0;
    }
    else {
      zDate_local._4_4_ = 1;
    }
  }
  else {
    zDate_local._4_4_ = 1;
  }
  return zDate_local._4_4_;
}

Assistant:

static int parseHhMmSs(const char *zDate, DateTime *p){
  int h, m, s;
  double ms = 0.0;
  if( getDigits(zDate, "20c:20e", &h, &m)!=2 ){
    return 1;
  }
  zDate += 5;
  if( *zDate==':' ){
    zDate++;
    if( getDigits(zDate, "20e", &s)!=1 ){
      return 1;
    }
    zDate += 2;
    if( *zDate=='.' && sqlite3Isdigit(zDate[1]) ){
      double rScale = 1.0;
      zDate++;
      while( sqlite3Isdigit(*zDate) ){
        ms = ms*10.0 + *zDate - '0';
        rScale *= 10.0;
        zDate++;
      }
      ms /= rScale;
    }
  }else{
    s = 0;
  }
  p->validJD = 0;
  p->rawS = 0;
  p->validHMS = 1;
  p->h = h;
  p->m = m;
  p->s = s + ms;
  if( parseTimezone(zDate, p) ) return 1;
  p->validTZ = (p->tz!=0)?1:0;
  return 0;
}